

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall
CVmObjDict::add_word
          (CVmObjDict *this,vm_obj_id_t self,char *str,size_t len,vm_obj_id_t obj,
          vm_prop_id_t voc_prop)

{
  int iVar1;
  dict_undo_rec *pdVar2;
  vm_dict_ext *pvVar3;
  CVmObjDict *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  dict_undo_rec *in_RDI;
  dict_undo_action in_R8D;
  vm_prop_id_t in_R9W;
  CVmObjDict *unaff_retaddr;
  dict_undo_rec *undo_rec;
  int added;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = add_hash_entry(unaff_retaddr,(char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         (int)((ulong)in_RDX >> 0x20),(vm_obj_id_t)in_RDX,
                         (vm_prop_id_t)((ulong)in_RCX >> 0x30),(int)undo_rec);
  if ((iVar1 != 0) && (G_undo_X != (CVmUndo *)0x0)) {
    pdVar2 = alloc_undo_rec(in_RCX,in_R8D,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
    pdVar2->obj = in_R8D;
    pdVar2->prop = in_R9W;
    add_undo_rec((CVmObjDict *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                 (vm_obj_id_t)((ulong)pdVar2 >> 0x20),in_RDI);
  }
  pvVar3 = get_ext((CVmObjDict *)in_RDI);
  pvVar3->modified_ = 1;
  return;
}

Assistant:

void CVmObjDict::add_word(VMG_ vm_obj_id_t self,
                          const char *str, size_t len,
                          vm_obj_id_t obj, vm_prop_id_t voc_prop)
{
    /* add the entry */
    int added = add_hash_entry(vmg_ str, len, TRUE, obj, voc_prop, FALSE);

    /* 
     *   if there's a global undo object, and we actually added a new
     *   entry, add undo for the change 
     */
    if (added && G_undo != 0)
    {
        dict_undo_rec *undo_rec;

        /* create the undo record */
        undo_rec = alloc_undo_rec(DICT_UNDO_ADD, str, len);
        undo_rec->obj = obj;
        undo_rec->prop = voc_prop;

        /* add the undo record */
        add_undo_rec(vmg_ self, undo_rec);
    }

    /* mark the object as modified since load */
    get_ext()->modified_ = TRUE;
}